

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O3

void __thiscall skiwi::anon_unknown_23::member::~member(member *this)

{
  compile_fixture::~compile_fixture(&this->super_compile_fixture);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {
      build_string_to_symbol();
      TEST_EQ("(2 3 4)", run("(member 2 (list 1 2 3 4))"));
      TEST_EQ("#f", run("(member 9 (list 1 2 3 4))"));
      TEST_EQ("(101 102)", run("(member 101 '(100 101 102))"));

      TEST_EQ("#f", run("(member 101 '((b a) (y x)))"));
      TEST_EQ("(a c)", run("(member 'a '(b a c))"));
      TEST_EQ("((y x))", run("(member '(y x) '((b a) (y x)))"));
      }